

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O1

void do_warcry(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  char *txt;
  long lVar5;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  iVar3 = get_skill(ch,(int)gsn_warcry);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar5 = (long)gsn_warcry;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar4 = CClass::GetIndex(this);
    if (*(short *)(lVar5 * 0x60 + 0x45a788 + (long)iVar4 * 2) <= sVar1) {
      bVar2 = is_affected(ch,(int)gsn_warcry);
      if (bVar2) {
        txt = "You are already affected by a warcry.\n\r";
      }
      else {
        if (0x13 < ch->mana) {
          iVar4 = number_percent();
          if ((float)iVar3 < (float)iVar4) {
            act("$n makes some soft grunting noises.",ch,(void *)0x0,(void *)0x0,0);
            send_to_char("You make soft grunting sounds but nothing happens.\n\r",ch);
            check_improve(ch,(int)gsn_warcry,false,2);
            ch->mana = ch->mana + -10;
            WAIT_STATE(ch,0xc);
            return;
          }
          act("$n lets out a blood freezing warcry!",ch,(void *)0x0,(void *)0x0,0);
          send_to_char("You let out a fierce warcry!\n\r",ch);
          check_improve(ch,(int)gsn_warcry,true,2);
          init_affect(&local_90);
          local_90.where = 0;
          local_90.type = gsn_warcry;
          local_90.level = ch->level;
          local_90.modifier = local_90.level / 7;
          local_90.location = 0x12;
          local_90.aftype = 1;
          local_90.duration = local_90.level;
          affect_to_char(ch,&local_90);
          local_90.location = 0x14;
          sVar1 = (short)((uint)(ch->level * -0x6667) >> 0x10);
          local_90.modifier = (sVar1 >> 1) - (sVar1 >> 0xf);
          affect_to_char(ch,&local_90);
          ch->mana = ch->mana + -0x14;
          WAIT_STATE(ch,0xc);
          return;
        }
        txt = "You don\'t have the mana.\n\r";
      }
      goto LAB_0029a4a3;
    }
  }
  txt = "You don\'t know how to warcry properly.\n\r";
LAB_0029a4a3:
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_warcry(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;

	float chance = get_skill(ch, gsn_warcry);

	if (chance == 0
		|| ch->level < skill_table[gsn_warcry].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to warcry properly.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_warcry))
	{
		send_to_char("You are already affected by a warcry.\n\r", ch);
		return;
	}

	if (ch->mana < 20)
	{
		send_to_char("You don't have the mana.\n\r", ch);
		return;
	}
	if (number_percent() > chance)
	{
		act("$n makes some soft grunting noises.", ch, 0, 0, TO_ROOM);
		send_to_char("You make soft grunting sounds but nothing happens.\n\r", ch);
		check_improve(ch, gsn_warcry, false, 2);
		ch->mana -= 10;

		WAIT_STATE(ch, 12);
		return;
	}

	act("$n lets out a blood freezing warcry!", ch, 0, 0, TO_ROOM);
	send_to_char("You let out a fierce warcry!\n\r", ch);
	check_improve(ch, gsn_warcry, true, 2);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_warcry;
	af.modifier = ch->level / 7;
	af.location = APPLY_HITROLL;
	af.duration = ch->level;
	af.level = ch->level;
	af.aftype = AFT_SKILL;
	affect_to_char(ch, &af);

	af.location = APPLY_SAVES;
	af.modifier = -(ch->level / 5);
	affect_to_char(ch, &af);

	ch->mana -= 20;
	WAIT_STATE(ch, 12);
}